

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemsemaphore_systemv.cpp
# Opt level: O0

key_t __thiscall
QSystemSemaphoreSystemV::handle
          (QSystemSemaphoreSystemV *this,QSystemSemaphorePrivate *self,AccessMode mode)

{
  long lVar1;
  bool bVar2;
  Type TVar3;
  int iVar4;
  key_t kVar5;
  char *__pathname;
  int *piVar6;
  int in_EDX;
  QSystemSemaphorePrivate *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int built;
  qt_semun init_op;
  undefined4 in_stack_fffffffffffffe08;
  SystemSemaphoreError in_stack_fffffffffffffe0c;
  QSystemSemaphorePrivate *in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  QLatin1String *in_stack_fffffffffffffe20;
  QSystemSemaphorePrivate *in_stack_fffffffffffffe28;
  QSystemSemaphoreSystemV *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe68;
  QChar QVar7;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  key_t local_124;
  undefined8 local_118;
  QChar local_10a;
  QLatin1StringView local_108;
  QChar local_c2;
  QLatin1StringView local_c0;
  QChar local_7a;
  QLatin1StringView local_78;
  QLatin1StringView in_stack_ffffffffffffffe0;
  
  QVar7.ucs = (char16_t)((ulong)in_stack_fffffffffffffe68 >> 0x30);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x18) == -1) {
    QNativeIpcKey::nativeKey
              ((QNativeIpcKey *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QFile::encodeName((QString *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffe10,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    QByteArray::~QByteArray((QByteArray *)0x8d5170);
    QString::~QString((QString *)0x8d517d);
    bVar2 = QByteArray::isEmpty((QByteArray *)0x8d518a);
    if (bVar2) {
      QSystemSemaphore::tr
                ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                 (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
      QVar7.ucs = (char16_t)((ulong)in_RSI >> 0x30);
      local_78 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                            (size_t)in_stack_fffffffffffffe10);
      QChar::QChar<char16_t,_true>(&local_7a,L' ');
      QString::arg<QLatin1String,_true>
                ((QString *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe1c,QVar7);
      QSystemSemaphorePrivate::setError
                (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(QString *)0x8d5239);
      QString::~QString((QString *)0x8d5248);
      QString::~QString((QString *)0x8d5255);
      local_124 = -1;
    }
    else {
      iVar4 = QtIpcCommon::createUnixKeyFile
                        ((QByteArray *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                        );
      if (iVar4 == -1) {
        QSystemSemaphore::tr
                  ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                   (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        local_c0 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                              (size_t)in_stack_fffffffffffffe10);
        QChar::QChar<char16_t,_true>(&local_c2,L' ');
        QString::arg<QLatin1String,_true>
                  ((QString *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe1c,QVar7);
        QSystemSemaphorePrivate::setError
                  (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(QString *)0x8d53ac);
        QString::~QString((QString *)0x8d53bb);
        QString::~QString((QString *)0x8d53c8);
        local_124 = -1;
      }
      else {
        *(bool *)(in_RDI + 0x20) = iVar4 == 1;
        __pathname = QByteArray::operator_cast_to_char_((QByteArray *)0x8d544a);
        TVar3 = QNativeIpcKey::type(&in_RSI->nativeKey);
        kVar5 = ftok(__pathname,(uint)TVar3);
        *(key_t *)(in_RDI + 0x18) = kVar5;
        if (*(int *)(in_RDI + 0x18) == -1) {
          QSystemSemaphore::tr
                    ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                     (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          local_108 = Qt::Literals::StringLiterals::operator____L1
                                ((char *)CONCAT44(in_stack_fffffffffffffe1c,
                                                  in_stack_fffffffffffffe18),
                                 (size_t)in_stack_fffffffffffffe10);
          QChar::QChar<char16_t,_true>(&local_10a,L' ');
          QString::arg<QLatin1String,_true>
                    ((QString *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                     in_stack_fffffffffffffe1c,QVar7);
          QSystemSemaphorePrivate::setError
                    (in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,(QString *)0x8d5528);
          QString::~QString((QString *)0x8d5537);
          QString::~QString((QString *)0x8d5544);
          local_124 = -1;
        }
        else {
          iVar4 = semget(*(key_t *)(in_RDI + 0x18),1,0x780);
          *(int *)(in_RDI + 0x1c) = iVar4;
          if (*(int *)(in_RDI + 0x1c) == -1) {
            piVar6 = __errno_location();
            if (*piVar6 == 0x11) {
              iVar4 = semget(*(key_t *)(in_RDI + 0x18),1,0x380);
              *(int *)(in_RDI + 0x1c) = iVar4;
            }
            if (*(int *)(in_RDI + 0x1c) == -1) {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (size_t)in_stack_fffffffffffffe10);
              QSystemSemaphorePrivate::setUnixErrorString
                        ((QSystemSemaphorePrivate *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         in_stack_ffffffffffffffe0);
              cleanHandle(in_stack_fffffffffffffe30,in_RSI);
              local_124 = -1;
              goto LAB_008d57b3;
            }
          }
          else {
            *(undefined1 *)(in_RDI + 0x21) = 1;
            *(undefined1 *)(in_RDI + 0x20) = 1;
          }
          if (in_EDX == 1) {
            *(undefined1 *)(in_RDI + 0x21) = 1;
            *(undefined1 *)(in_RDI + 0x20) = 1;
          }
          if (((*(byte *)(in_RDI + 0x21) & 1) != 0) && (-1 < in_RSI->initialValue)) {
            local_118 = CONCAT44(0xaaaaaaaa,in_RSI->initialValue);
            iVar4 = semctl(*(int *)(in_RDI + 0x1c),0,0x10,local_118);
            if (iVar4 == -1) {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (size_t)in_stack_fffffffffffffe10);
              QSystemSemaphorePrivate::setUnixErrorString
                        ((QSystemSemaphorePrivate *)
                         CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         in_stack_ffffffffffffffe0);
              cleanHandle(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
              local_124 = -1;
              goto LAB_008d57b3;
            }
          }
          local_124 = *(key_t *)(in_RDI + 0x18);
        }
      }
    }
  }
  else {
    local_124 = *(key_t *)(in_RDI + 0x18);
  }
LAB_008d57b3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_124;
}

Assistant:

key_t QSystemSemaphoreSystemV::handle(QSystemSemaphorePrivate *self, QSystemSemaphore::AccessMode mode)
{
    if (unix_key != -1)
        return unix_key;  // we already have a semaphore

#if defined(Q_OS_DARWIN)
    if (qt_apple_isSandboxed()) {
        // attempting to use System V semaphores will get us a SIGSYS
        self->setError(QSystemSemaphore::PermissionDenied,
                       QSystemSemaphore::tr("%1: System V semaphores are not available for "
                                            "sandboxed applications. Please build Qt with "
                                            "-feature-ipc_posix")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }
#endif

    nativeKeyFile = QFile::encodeName(self->nativeKey.nativeKey());
    if (nativeKeyFile.isEmpty()) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: key is empty")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // ftok requires that an actual file exists somewhere
    int built = QtIpcCommon::createUnixKeyFile(nativeKeyFile);
    if (-1 == built) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: unable to make key")
                       .arg("QSystemSemaphore::handle:"_L1));

        return -1;
    }
    createdFile = (1 == built);

    // Get the unix key for the created file
    unix_key = ftok(nativeKeyFile, int(self->nativeKey.type()));
    if (-1 == unix_key) {
        self->setError(QSystemSemaphore::KeyError,
                       QSystemSemaphore::tr("%1: ftok failed")
                       .arg("QSystemSemaphore::handle:"_L1));
        return -1;
    }

    // Get semaphore
    semaphore = semget(unix_key, 1, 0600 | IPC_CREAT | IPC_EXCL);
    if (-1 == semaphore) {
        if (errno == EEXIST)
            semaphore = semget(unix_key, 1, 0600 | IPC_CREAT);
        if (-1 == semaphore) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    } else {
        createdSemaphore = true;
        // Force cleanup of file, it is possible that it can be left over from a crash
        createdFile = true;
    }

    if (mode == QSystemSemaphore::Create) {
        createdSemaphore = true;
        createdFile = true;
    }

    // Created semaphore so initialize its value.
    if (createdSemaphore && self->initialValue >= 0) {
        qt_semun init_op;
        init_op.val = self->initialValue;
        if (-1 == semctl(semaphore, 0, SETVAL, init_op)) {
            self->setUnixErrorString("QSystemSemaphore::handle"_L1);
            cleanHandle(self);
            return -1;
        }
    }

    return unix_key;
}